

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

error_or_n<int,_std::uint64_t> * __thiscall
pstore::http::details::
read_payload_length<pstore::http::buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>,int>
          (error_or_n<int,_std::uint64_t> *__return_storage_ptr__,details *this,
          buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
          *reader,int io,uint base_length)

{
  int local_30;
  undefined4 local_2c;
  error_or_n<int,_unsigned_short> local_28;
  
  local_2c = SUB84(reader,0);
  local_30 = io;
  if ((uint)io < 0x7e) {
    error_or<std::tuple<int,unsigned_long>>::error_or<int&,unsigned_int&>
              ((error_or<std::tuple<int,unsigned_long>> *)__return_storage_ptr__,&local_2c,&local_30
              );
  }
  else if (io == 0x7e) {
    read_and_byte_swap<unsigned_short,pstore::http::buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>,int>
              (&local_28,this,reader,0x7e);
    error_or<std::tuple<int,unsigned_long>>::error_or<std::tuple<int,unsigned_short>,void>
              (__return_storage_ptr__,&local_28);
    error_or<std::tuple<int,_unsigned_short>_>::~error_or(&local_28);
  }
  else {
    read_and_byte_swap<unsigned_long,pstore::http::buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>,int>
              (__return_storage_ptr__,this,reader,io);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or_n<IO, std::uint64_t> read_payload_length (Reader & reader, IO io,
                                                               unsigned base_length) {
                if (base_length < 126U) {
                    // "If 0-125, that is the payload length."
                    return error_or_n<IO, std::uint64_t>{in_place, io, base_length};
                }
                if (base_length == 126U) {
                    // "If 126, the following 2 bytes interpreted as a 16-bit unsigned integer are
                    // the payload length."
                    return read_and_byte_swap<std::uint16_t> (reader, io);
                }
                // "If 127, the following 8 bytes interpreted as a 64-bit unsigned integer (the most
                // significant bit MUST be 0) are the payload length. Multibyte length quantities
                // are expressed in network byte order."
                return read_and_byte_swap<std::uint64_t> (reader, io);
            }